

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-internal-utils.cc
# Opt level: O1

string * testing::internal::JoinAsKeyValueTuple
                   (string *__return_storage_ptr__,
                   vector<const_char_*,_std::allocator<const_char_*>_> *names,Strings *values)

{
  long lVar1;
  bool bVar2;
  long *plVar3;
  size_type *psVar4;
  size_t i;
  anon_class_16_2_1175fbd1 build_one;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  vector<const_char_*,_std::allocator<const_char_*>_> *local_40;
  Strings *local_38;
  
  bVar2 = IsTrue((long)(names->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(names->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 3 ==
                 (long)(values->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(values->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start >> 5);
  if (!bVar2) {
    GTestLog::GTestLog((GTestLog *)&local_68,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/googletest-src/googlemock/src/gmock-internal-utils.cc"
                       ,0x3d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition names.size() == values.size() failed. ",0x30);
    GTestLog::~GTestLog((GTestLog *)&local_68);
  }
  if ((values->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (values->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    local_40 = names;
    local_38 = values;
    JoinAsKeyValueTuple(std::vector<char_const*,std::allocator<char_const*>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
    ::$_0::operator()[abi_cxx11_(&local_68,&local_40,0);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,0x4b33ca);
    local_48 = &__return_storage_ptr__->field_2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_48;
    psVar4 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar4) {
      lVar1 = plVar3[3];
      local_48->_M_allocated_capacity = *psVar4;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    }
    __return_storage_ptr__->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (0x20 < (ulong)((long)(values->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(values->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)) {
      i = 1;
      do {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        JoinAsKeyValueTuple(std::vector<char_const*,std::allocator<char_const*>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
        ::$_0::operator()[abi_cxx11_(&local_68,&local_40,i);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_68._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        i = i + 1;
      } while (i < (ulong)((long)(values->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(values->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ std::string JoinAsKeyValueTuple(
    const std::vector<const char*>& names, const Strings& values) {
  GTEST_CHECK_(names.size() == values.size());
  if (values.empty()) {
    return "";
  }
  const auto build_one = [&](const size_t i) {
    return std::string(names[i]) + ": " + values[i];
  };
  std::string result = "(" + build_one(0);
  for (size_t i = 1; i < values.size(); i++) {
    result += ", ";
    result += build_one(i);
  }
  result += ")";
  return result;
}